

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitExtractLaneExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  WasmType type;
  EmitInfo EVar1;
  WasmRegisterSpace *this_00;
  EmitInfo EVar2;
  EmitInfo EVar3;
  undefined6 in_register_00000032;
  EmitInfo local_48;
  EmitInfo simdArgInfo;
  EmitInfo indexInfo;
  
  type = *signature;
  EVar1 = PopEvalStack(this,signature[1],L"Argument should be of type V128");
  local_48 = EVar1;
  ReleaseLocation(this,&local_48);
  this_00 = GetRegisterSpace(this,type);
  EVar3.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  EVar2 = EmitLaneIndex(this,op);
  simdArgInfo = EVar2;
  ReleaseLocation(this,&simdArgInfo);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x10])
            (this->m_writer,CONCAT62(in_register_00000032,op) & 0xffffffff,
             (ulong)EVar3.super_EmitInfoBase.location,EVar1,(ulong)EVar2 & 0xffffffff);
  EVar3.type = type;
  return EVar3;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitExtractLaneExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature)
{
    WasmTypes::WasmType resultType = signature[0];
    WasmTypes::WasmType simdArgType = signature[1];

    EmitInfo simdArgInfo = PopEvalStack(simdArgType, _u("Argument should be of type V128"));
    ReleaseLocation(&simdArgInfo);

    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();
    EmitInfo resultInfo(resultReg, resultType);

    //put index into a register to reuse the existing infra in Interpreter and Compiler
    EmitInfo indexInfo = EmitLaneIndex(op);
    ReleaseLocation(&indexInfo);

    m_writer->AsmReg3(op, resultReg, simdArgInfo.location, indexInfo.location);
    return resultInfo;
}